

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_setup_file_location(iso9660_conflict *iso9660,int location)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  int in_ESI;
  long in_RDI;
  int total_block;
  int symlocation;
  int joliet;
  int depth;
  int block;
  size_t size;
  isofile *file;
  isoent *np;
  isoent *isoent;
  int local_44;
  int local_38;
  int *in_stack_ffffffffffffffd0;
  isoent *in_stack_ffffffffffffffd8;
  long lVar4;
  iso9660_conflict *iso9660_00;
  int local_c;
  
  *(undefined4 *)(in_RDI + 0x120) = 0;
  lVar4 = *(long *)(in_RDI + 0x10320);
  local_c = in_ESI;
  if (lVar4 != 0) {
    *(int *)(*(long *)(lVar4 + 0x18) + 0xa4) = in_ESI;
    iVar3 = archive_entry_size(*(archive_entry **)(*(long *)(lVar4 + 0x18) + 0x20));
    iVar2 = (int)(iVar3 + 0x7ff >> 0xb);
    local_c = iVar2 + in_ESI;
    *(int *)(in_RDI + 0x120) = iVar2 + *(int *)(in_RDI + 0x120);
  }
  lVar4 = *(long *)(in_RDI + 0x10340);
  if (lVar4 != 0) {
    *(int *)(*(long *)(lVar4 + 0x18) + 0xa4) = local_c;
    in_stack_ffffffffffffffd0 = (int *)fd_boot_image_size((uint)*(byte *)(in_RDI + 0x10368));
    if (in_stack_ffffffffffffffd0 == (int *)0x0) {
      in_stack_ffffffffffffffd0 =
           (int *)archive_entry_size(*(archive_entry **)(*(long *)(lVar4 + 0x18) + 0x20));
    }
    iVar2 = (int)in_stack_ffffffffffffffd0 + 0x7ff >> 0xb;
    local_c = iVar2 + local_c;
    *(int *)(in_RDI + 0x120) = iVar2 + *(int *)(in_RDI + 0x120);
    *(int *)(*(long *)(lVar4 + 0x18) + 0xa0) = iVar2;
  }
  local_38 = 0;
  if (((*(uint *)(in_RDI + 0x10370) >> 0x17 & 3) == 0) &&
     ((*(uint *)(in_RDI + 0x10370) >> 0x11 & 3) != 0)) {
    bVar1 = true;
    iso9660_00 = *(iso9660_conflict **)(in_RDI + 0xe8);
  }
  else {
    bVar1 = false;
    iso9660_00 = *(iso9660_conflict **)(in_RDI + 0xb8);
  }
  do {
    _isoent_file_location(iso9660_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (((iso9660_00->utf16be).length == 0) ||
       (((!bVar1 &&
         (((*(uint *)(in_RDI + 0x10370) >> 0x17 & 3) != 0 ||
          (*(int *)(in_RDI + 0xd0) <= local_38 + 2)))) &&
        (((*(uint *)(in_RDI + 0x10370) >> 0x17 & 3) == 0 ||
         (*(int *)(in_RDI + 0xd0) <= local_38 + 1)))))) {
      for (; iso9660_00 != (iso9660_conflict *)(iso9660_00->cur_dirstr).s;
          iso9660_00 = (iso9660_conflict *)(iso9660_00->cur_dirstr).s) {
        if (iso9660_00->sconv_to_utf16be != (archive_string_conv *)0x0) {
          iso9660_00 = (iso9660_conflict *)iso9660_00->sconv_to_utf16be;
          break;
        }
        local_38 = local_38 + -1;
      }
    }
    else {
      iso9660_00 = (iso9660_conflict *)(iso9660_00->utf16be).length;
      local_38 = local_38 + 1;
    }
    if (iso9660_00 == (iso9660_conflict *)(iso9660_00->cur_dirstr).s) {
      local_44 = 0;
      for (lVar4 = *(long *)(in_RDI + 0x98); lVar4 != 0; lVar4 = *(long *)(lVar4 + 8)) {
        if (*(int *)(lVar4 + 0xb8) != 0) {
          *(long *)(lVar4 + 0xb0) = lVar4 + 0x90;
          do {
            *(int *)(*(long *)(lVar4 + 0xb0) + 0x14) = local_c;
            local_c = *(int *)(*(long *)(lVar4 + 0xb0) + 0x10) + local_c;
            local_44 = *(int *)(*(long *)(lVar4 + 0xb0) + 0x10) + local_44;
            *(undefined8 *)(lVar4 + 0xb0) = *(undefined8 *)(*(long *)(lVar4 + 0xb0) + 0x18);
          } while (*(long *)(lVar4 + 0xb0) != 0);
        }
      }
      *(int *)(in_RDI + 0x120) = local_44 + *(int *)(in_RDI + 0x120);
      return;
    }
  } while( true );
}

Assistant:

static void
isoent_setup_file_location(struct iso9660 *iso9660, int location)
{
	struct isoent *isoent;
	struct isoent *np;
	struct isofile *file;
	size_t size;
	int block;
	int depth;
	int joliet;
	int symlocation;
	int total_block;

	iso9660->total_file_block = 0;
	if ((isoent = iso9660->el_torito.catalog) != NULL) {
		isoent->file->content.location = location;
		block = (int)((archive_entry_size(isoent->file->entry) +
		    LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);
		location += block;
		iso9660->total_file_block += block;
	}
	if ((isoent = iso9660->el_torito.boot) != NULL) {
		isoent->file->content.location = location;
		size = fd_boot_image_size(iso9660->el_torito.media_type);
		if (size == 0)
			size = (size_t)archive_entry_size(isoent->file->entry);
		block = ((int)size + LOGICAL_BLOCK_SIZE -1)
		    >> LOGICAL_BLOCK_BITS;
		location += block;
		iso9660->total_file_block += block;
		isoent->file->content.blocks = block;
	}

	depth = 0;
	symlocation = -16;
	if (!iso9660->opt.rr && iso9660->opt.joliet) {
		joliet = 1;
		np = iso9660->joliet.rootent;
	} else {
		joliet = 0;
		np = iso9660->primary.rootent;
	}
	do {
		_isoent_file_location(iso9660, np, &symlocation);

		if (np->subdirs.first != NULL &&
		    (joliet ||
		    ((iso9660->opt.rr == OPT_RR_DISABLED &&
		      depth + 2 < iso9660->primary.max_depth) ||
		     (iso9660->opt.rr &&
		      depth + 1 < iso9660->primary.max_depth)))) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	total_block = 0;
	for (file = iso9660->data_file_list.first;
	    file != NULL; file = file->datanext) {

		if (!file->write_content)
			continue;

		file->cur_content = &(file->content);
		do {
			file->cur_content->location = location;
			location += file->cur_content->blocks;
			total_block += file->cur_content->blocks;
			/* Next fragument */
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}
	iso9660->total_file_block += total_block;
}